

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall icu_63::UVector::setSize(UVector *this,int32_t newSize,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  ulong uVar3;
  void *pvVar4;
  int index;
  
  if (-1 < newSize) {
    index = this->count;
    iVar1 = index - newSize;
    if (index < newSize) {
      UVar2 = ensureCapacity(this,newSize,status);
      if (UVar2 == '\0') {
        return;
      }
      uVar3 = (ulong)this->count;
      if (this->count < newSize) {
        do {
          this->elements[uVar3].pointer = (void *)0x0;
          uVar3 = uVar3 + 1;
        } while ((uint)newSize != uVar3);
      }
    }
    else {
      while (index != newSize && SBORROW4(index,newSize) == iVar1 < 0) {
        index = index + -1;
        pvVar4 = orphanElementAt(this,index);
        if ((pvVar4 != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0)) {
          (*this->deleter)(pvVar4);
        }
        iVar1 = index - newSize;
      }
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector::setSize(int32_t newSize, UErrorCode &status) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        if (!ensureCapacity(newSize, status)) {
            return;
        }
        UElement empty;
        empty.pointer = NULL;
        empty.integer = 0;
        for (i=count; i<newSize; ++i) {
            elements[i] = empty;
        }
    } else {
        /* Most efficient to count down */
        for (i=count-1; i>=newSize; --i) {
            removeElementAt(i);
        }
    }
    count = newSize;
}